

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

opStatus __thiscall llvm::APFloat::divide(APFloat *this,APFloat *RHS,roundingMode RM)

{
  byte *pbVar1;
  byte bVar2;
  lostFraction lost_fraction;
  opStatus oVar3;
  opStatus oVar4;
  Storage *rhs;
  Storage *this_00;
  
  if ((this->U).semantics != (RHS->U).semantics) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only call on two APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3ca,"opStatus llvm::APFloat::divide(const APFloat &, roundingMode)");
  }
  this_00 = &this->U;
  rhs = &RHS->U;
  if ((this->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    oVar4 = detail::DoubleAPFloat::divide
                      ((DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)&rhs->IEEE,RM);
    return oVar4;
  }
  pbVar1 = (byte *)((long)&this->U + 0x12);
  *pbVar1 = *pbVar1 ^ *(byte *)((long)&RHS->U + 0x12) & 8;
  oVar4 = detail::IEEEFloat::divideSpecials(&this_00->IEEE,&rhs->IEEE);
  bVar2 = *(byte *)((long)&this->U + 0x12);
  if ((bVar2 & 7) != 3 && (bVar2 & 6) != 0) {
    lost_fraction = detail::IEEEFloat::divideSignificand(&this_00->IEEE,&rhs->IEEE);
    oVar3 = detail::IEEEFloat::normalize(&this_00->IEEE,RM,lost_fraction);
    oVar4 = oVar3 | opInexact;
    if (lost_fraction == lfExactlyZero) {
      oVar4 = oVar3;
    }
  }
  return oVar4;
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }